

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

void Col_RopeIterForward(ColRopeIterator *it,size_t nb)

{
  void **ppvVar1;
  Col_StringFormat CVar2;
  ulong uVar3;
  ulong uVar4;
  Col_Char2 *pCVar5;
  Col_Char1 *pCVar6;
  bool bVar7;
  
  if (nb != 0) {
    uVar3 = it->length;
    uVar4 = it->index;
    if (uVar3 <= uVar4) {
      Col_Error(COL_VALUECHECK,ColibriDomain,0xf,it);
      return;
    }
    if (nb < uVar3 - uVar4) {
      uVar4 = uVar4 + nb;
      it->index = uVar4;
      if (((it->chunk).first <= uVar4) && (uVar4 <= (it->chunk).last)) {
        if ((it->chunk).accessProc == (undefined1 *)0x0) {
          CVar2 = (it->chunk).current.direct.format;
          if ((CVar2 - COL_UCS1 < 2) || (CVar2 == COL_UCS4)) {
            ppvVar1 = &(it->chunk).current.direct.address;
            *ppvVar1 = (void *)((long)*ppvVar1 + CVar2 * nb);
          }
          else if (CVar2 == COL_UTF8) {
            while (bVar7 = nb != 0, nb = nb - 1, bVar7) {
              pCVar6 = Col_Utf8Next((Col_Char1 *)(it->chunk).current.direct.address);
              (it->chunk).current.direct.address = pCVar6;
            }
          }
          else if (CVar2 == COL_UTF16) {
            while (bVar7 = nb != 0, nb = nb - 1, bVar7) {
              pCVar5 = Col_Utf16Next((Col_Char2 *)(it->chunk).current.direct.address);
              (it->chunk).current.direct.address = pCVar5;
            }
          }
        }
        else {
          ppvVar1 = &(it->chunk).current.direct.address;
          *ppvVar1 = (void *)((long)*ppvVar1 + nb);
        }
      }
    }
    else {
      (it->chunk).first = 0xffffffffffffffff;
      if (it->rope == 0) {
        (it->chunk).last = uVar4;
      }
      it->index = uVar3;
    }
  }
  return;
}

Assistant:

void
Col_RopeIterForward(
    Col_RopeIterator it,    /*!< The iterator to move. */
    size_t nb)              /*!< Offset to move forward. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPEITER,it} */
    TYPECHECK_ROPEITER(it) return;

    if (nb == 0) {
        /*
         * No-op.
         */

        return;
    }

    /*! @valuecheck{COL_ERROR_ROPEITER_END,it} (only when **nb** != 0) */
    VALUECHECK_ROPEITER(it) return;

    if (nb >= it->length - it->index) {
        /*
         * End of rope/string.
         */

        it->chunk.first = SIZE_MAX; /* Invalidate traversal info. */
        if (it->rope == WORD_NIL) {
            /* 
             * String iterator mode, save current index for backward interation
             * from end (see Col_RopeIterBackward).
             */
            it->chunk.last = it->index;
        }
        it->index = it->length;
        return;
    }
    it->index += nb;
    if (it->index >= it->chunk.first && it->index <= it->chunk.last) {
        /*
         * Update current chunk pointer.
         */

        if (it->chunk.accessProc) it->chunk.current.access.index += nb;
        else {
            ASSERT(it->chunk.current.direct.address);
            switch (it->chunk.current.direct.format) {
            case COL_UCS1:
            case COL_UCS2:
            case COL_UCS4:
                it->chunk.current.direct.address
                        = (const char *) it->chunk.current.direct.address
                        + nb * CHAR_WIDTH(it->chunk.current.direct.format);
                break;

            case COL_UTF8:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf8Next(
                            (const Col_Char1 *) it->chunk.current.direct.address);
                break;

            case COL_UTF16:
                while (nb--)
                    it->chunk.current.direct.address
                            = (const char *) Col_Utf16Next(
                            (const Col_Char2 *) it->chunk.current.direct.address);
                break;
            }
        }
    }
}